

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbformat.cc
# Opt level: O2

int __thiscall
leveldb::InternalKeyComparator::Compare(InternalKeyComparator *this,Slice *akey,Slice *bkey)

{
  uint uVar1;
  
  uVar1 = (*this->user_comparator_->_vptr_Comparator[2])();
  if (uVar1 == 0) {
    if (*(ulong *)(bkey->data_ + (bkey->size_ - 8)) < *(ulong *)(akey->data_ + (akey->size_ - 8))) {
      uVar1 = 0xffffffff;
    }
    else {
      uVar1 = (uint)(*(ulong *)(akey->data_ + (akey->size_ - 8)) <
                    *(ulong *)(bkey->data_ + (bkey->size_ - 8)));
    }
  }
  return uVar1;
}

Assistant:

int InternalKeyComparator::Compare(const Slice& akey, const Slice& bkey) const {
  // Order by:
  //    increasing user key (according to user-supplied comparator)
  //    decreasing sequence number
  //    decreasing type (though sequence# should be enough to disambiguate)
  int r = user_comparator_->Compare(ExtractUserKey(akey), ExtractUserKey(bkey));
  if (r == 0) {
    const uint64_t anum = DecodeFixed64(akey.data() + akey.size() - 8);
    const uint64_t bnum = DecodeFixed64(bkey.data() + bkey.size() - 8);
    if (anum > bnum) {
      r = -1;
    } else if (anum < bnum) {
      r = +1;
    }
  }
  return r;
}